

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture2D_GL.cpp
# Opt level: O0

void __thiscall
Diligent::Texture2D_GL::Texture2D_GL
          (Texture2D_GL *this,IReferenceCounters *pRefCounters,
          FixedBlockMemoryAllocator *TexViewObjAllocator,RenderDeviceGLImpl *pDeviceGL,
          GLContextState *GLState,TextureDesc *TexDesc,TextureData *pInitData,bool bIsDeviceInternal
          )

{
  Uint32 _MaxX;
  Char *pCVar1;
  uint *puVar2;
  GLenum GVar3;
  GLTextureObj local_cc;
  undefined1 local_c0 [8];
  string msg_1;
  uint local_98;
  uint local_94;
  undefined1 local_90 [8];
  Box DstBox;
  Uint32 Mip;
  GLenum err_1;
  string msg;
  GLenum err;
  bool bIsDeviceInternal_local;
  TextureDesc *TexDesc_local;
  GLContextState *GLState_local;
  RenderDeviceGLImpl *pDeviceGL_local;
  FixedBlockMemoryAllocator *TexViewObjAllocator_local;
  IReferenceCounters *pRefCounters_local;
  Texture2D_GL *this_local;
  
  GVar3 = 0xde1;
  if (1 < TexDesc->SampleCount) {
    GVar3 = 0x9100;
  }
  TextureBaseGL::TextureBaseGL
            (&this->super_TextureBaseGL,pRefCounters,TexViewObjAllocator,pDeviceGL,TexDesc,GVar3,
             pInitData,bIsDeviceInternal);
  (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
  super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>.
  super_ObjectBase<Diligent::ITextureGL>.super_RefCountedObject<Diligent::ITextureGL>.
  super_ITextureGL.super_ITexture = (ITexture)&PTR_QueryInterface_013a5cf0;
  if (TexDesc->Usage != USAGE_STAGING) {
    GLContextState::BindTexture
              (GLState,-1,(this->super_TextureBaseGL).m_BindTarget,
               &(this->super_TextureBaseGL).m_GlTexture);
    if ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
        super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
        .m_Desc.SampleCount < 2) {
      (*__glewTexStorage2D)
                ((this->super_TextureBaseGL).m_BindTarget,
                 (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                 super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 .m_Desc.MipLevels,(this->super_TextureBaseGL).m_GLTexFormat,
                 (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                 super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 .m_Desc.Width,
                 (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                 super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 .m_Desc.Height);
      DstBox.MaxZ = glGetError();
      if (DstBox.MaxZ != 0) {
        LogError<true,char[46],char[17],unsigned_int>
                  (false,"Texture2D_GL",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                   ,0x5e,(char (*) [46])"Failed to allocate storage for the 2D texture",
                   (char (*) [17])"\nGL Error Code: ",&DstBox.MaxZ);
      }
      TextureBaseGL::SetDefaultGLParameters(&this->super_TextureBaseGL);
      if ((pInitData != (TextureData *)0x0) &&
         (pInitData->pSubResources != (TextureSubResData *)0x0)) {
        if ((this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            .m_Desc.MipLevels == pInitData->NumSubresources) {
          for (DstBox.MinZ = 0;
              DstBox.MinZ <
              (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
              super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
              .m_Desc.MipLevels; DstBox.MinZ = DstBox.MinZ + 1) {
            local_94 = (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                       .m_Desc.Width >> ((byte)DstBox.MinZ & 0x1f);
            local_98 = 1;
            puVar2 = std::max<unsigned_int>(&stack0xffffffffffffff6c,&stack0xffffffffffffff68);
            _MaxX = *puVar2;
            msg_1.field_2._12_4_ =
                 (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                 super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 .m_Desc.Height >> ((byte)DstBox.MinZ & 0x1f);
            msg_1.field_2._8_4_ = 1;
            puVar2 = std::max<unsigned_int>
                               ((uint *)(msg_1.field_2._M_local_buf + 0xc),
                                (uint *)(msg_1.field_2._M_local_buf + 8));
            Box::Box((Box *)local_90,0,_MaxX,0,*puVar2);
            UpdateData(this,GLState,DstBox.MinZ,0,(Box *)local_90,
                       pInitData->pSubResources + DstBox.MinZ);
          }
        }
        else {
          FormatString<char[33]>
                    ((string *)local_c0,(char (*) [33])"Incorrect number of subresources");
          pCVar1 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar1,"Texture2D_GL",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                     ,0x7a);
          std::__cxx11::string::~string((string *)local_c0);
        }
      }
    }
    else {
      (*__glewTexStorage2DMultisample)
                ((this->super_TextureBaseGL).m_BindTarget,
                 (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                 super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 .m_Desc.SampleCount,(this->super_TextureBaseGL).m_GLTexFormat,
                 (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                 super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 .m_Desc.Width,
                 (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
                 super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 .m_Desc.Height,'\x01');
      msg.field_2._8_4_ = glGetError();
      if (msg.field_2._8_4_ != 0) {
        LogError<true,char[58],char[17],unsigned_int>
                  (false,"Texture2D_GL",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                   ,0x4c,(char (*) [58])"Failed to allocate storage for the 2D multisample texture",
                   (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
      }
      TextureBaseGL::SetDefaultGLParameters(&this->super_TextureBaseGL);
      if ((pInitData != (TextureData *)0x0) &&
         (pInitData->pSubResources != (TextureSubResData *)0x0)) {
        FormatString<char[50]>
                  ((string *)&Mip,(char (*) [50])"Multisampled textures cannot be modified directly"
                  );
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"Texture2D_GL",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                   ,0x55);
        std::__cxx11::string::~string((string *)&Mip);
      }
    }
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::SetName
              (&(this->super_TextureBaseGL).m_GlTexture,
               (this->super_TextureBaseGL).super_TextureBase<Diligent::EngineGLImplTraits>.
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.super_DeviceObjectAttribs.Name);
    GVar3 = (this->super_TextureBaseGL).m_BindTarget;
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::Null();
    GLContextState::BindTexture(GLState,-1,GVar3,&local_cc);
    GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
              (&local_cc);
  }
  return;
}

Assistant:

Texture2D_GL::Texture2D_GL(IReferenceCounters*        pRefCounters,
                           FixedBlockMemoryAllocator& TexViewObjAllocator,
                           RenderDeviceGLImpl*        pDeviceGL,
                           GLContextState&            GLState,
                           const TextureDesc&         TexDesc,
                           const TextureData*         pInitData /*= nullptr*/,
                           bool                       bIsDeviceInternal /*= false*/) :
    // clang-format off
    TextureBaseGL
    {
        pRefCounters,
        TexViewObjAllocator,
        pDeviceGL,
        TexDesc,
        static_cast<GLenum>(TexDesc.SampleCount > 1 ? GL_TEXTURE_2D_MULTISAMPLE : GL_TEXTURE_2D),
        pInitData,
        bIsDeviceInternal
    }
// clang-format on
{
    if (TexDesc.Usage == USAGE_STAGING)
    {
        // We will use PBO initialized by TextureBaseGL
        return;
    }

    GLState.BindTexture(-1, m_BindTarget, m_GlTexture);

    if (m_Desc.SampleCount > 1)
    {
#if GL_ARB_texture_storage_multisample
        //                                               format          width          height         depth
        glTexStorage2DMultisample(m_BindTarget, m_Desc.SampleCount, m_GLTexFormat, m_Desc.Width, m_Desc.Height, GL_TRUE);
        // The last parameter specifies whether the image will use identical sample locations and the same number of
        // samples for all texels in the image, and the sample locations will not depend on the internal format or size
        // of the image.
        DEV_CHECK_GL_ERROR_AND_THROW("Failed to allocate storage for the 2D multisample texture");
        // * An INVALID_ENUM error is generated if sizedinternalformat is not colorrenderable,
        //   depth - renderable, or stencil - renderable
        // * An INVALID_OPERATION error is generated if samples is greater than the maximum number of samples
        //   supported for this target and internalformat. The maximum number of samples supported can be
        //   determined by calling glGetInternalformativ with a pname of GL_SAMPLES

        SetDefaultGLParameters();

        VERIFY(pInitData == nullptr || pInitData->pSubResources == nullptr, "Multisampled textures cannot be modified directly");
#else
        LOG_ERROR_AND_THROW("Multisampled textures are not supported");
#endif
    }
    else
    {
        //                             levels             format          width         height
        glTexStorage2D(m_BindTarget, m_Desc.MipLevels, m_GLTexFormat, m_Desc.Width, m_Desc.Height);
        DEV_CHECK_GL_ERROR_AND_THROW("Failed to allocate storage for the 2D texture");
        // When target is GL_TEXTURE_2D, calling glTexStorage2D is equivalent to the following pseudo-code:
        //for (i = 0; i < levels; i++)
        //{
        //    glTexImage2D(target, i, internalformat, width, height, 0, format, type, NULL);
        //    width = max(1, (width / 2));
        //    height = max(1, (height / 2));
        //}

        SetDefaultGLParameters();

        if (pInitData != nullptr && pInitData->pSubResources != nullptr)
        {
            if (m_Desc.MipLevels == pInitData->NumSubresources)
            {
                for (Uint32 Mip = 0; Mip < m_Desc.MipLevels; ++Mip)
                {
                    Box DstBox{0, std::max(m_Desc.Width >> Mip, 1U),
                               0, std::max(m_Desc.Height >> Mip, 1U)};
                    // UpdateData() is a virtual function. If we try to call it through vtbl from here,
                    // we will get into TextureBaseGL::UpdateData(), because instance of Texture2D_GL
                    // is not fully constructed yet.
                    // To call the required function, we need to explicitly specify the class:
                    Texture2D_GL::UpdateData(GLState, Mip, 0, DstBox, pInitData->pSubResources[Mip]);
                }
            }
            else
            {
                UNEXPECTED("Incorrect number of subresources");
            }
        }
    }

    m_GlTexture.SetName(m_Desc.Name);

    GLState.BindTexture(-1, m_BindTarget, GLObjectWrappers::GLTextureObj::Null());
}